

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

void Abc_ZddManCreatePerms(Abc_ZddMan *p,int nPermSize)

{
  int iVar1;
  int *__s;
  int *__s_00;
  int *__s_01;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar1 = p->nVars;
  if (iVar1 * 2 != (nPermSize + -1) * nPermSize) {
    __assert_fail("2 * p->nVars == nPermSize * (nPermSize - 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                  ,0xd4,"void Abc_ZddManCreatePerms(Abc_ZddMan *, int)");
  }
  if (p->nPermSize == 0) {
    p->nPermSize = nPermSize;
    sVar4 = (long)iVar1 * 4;
    __s = (int *)malloc(sVar4);
    memset(__s,0xff,sVar4);
    p->pV2TI = __s;
    __s_00 = (int *)malloc(sVar4);
    memset(__s_00,0xff,sVar4);
    p->pV2TJ = __s_00;
    sVar4 = (ulong)(uint)(nPermSize * nPermSize) << 2;
    __s_01 = (int *)malloc(sVar4);
    memset(__s_01,0xff,sVar4);
    uVar8 = (ulong)(uint)nPermSize;
    if (nPermSize < 1) {
      uVar8 = 0;
    }
    p->pT2V = __s_01;
    iVar2 = 1;
    iVar6 = 0;
    uVar7 = 0;
    while (uVar7 != uVar8) {
      for (lVar5 = 0; iVar3 = (int)lVar5, iVar2 + lVar5 < (long)nPermSize; lVar5 = lVar5 + 1) {
        __s[iVar6 + lVar5] = (int)uVar7;
        __s_00[iVar6 + lVar5] = iVar2 + iVar3;
        __s_01[iVar2 + lVar5] = iVar6 + iVar3;
      }
      iVar6 = iVar6 + iVar3;
      iVar2 = iVar2 + 1;
      __s_01 = __s_01 + nPermSize;
      uVar7 = uVar7 + 1;
    }
    if (iVar6 == iVar1) {
      return;
    }
    __assert_fail("v == p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                  ,0xe1,"void Abc_ZddManCreatePerms(Abc_ZddMan *, int)");
  }
  __assert_fail("p->nPermSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                ,0xd5,"void Abc_ZddManCreatePerms(Abc_ZddMan *, int)");
}

Assistant:

void Abc_ZddManCreatePerms( Abc_ZddMan * p, int nPermSize )
{
    int i, j, v = 0;
    assert( 2 * p->nVars == nPermSize * (nPermSize - 1) );
    assert( p->nPermSize == 0 );
    p->nPermSize = nPermSize;
    p->pV2TI = ABC_FALLOC( int, p->nVars );
    p->pV2TJ = ABC_FALLOC( int, p->nVars );
    p->pT2V  = ABC_FALLOC( int, p->nPermSize * p->nPermSize );
    for ( i = 0; i < nPermSize; i++ )
        for ( j = i + 1; j < nPermSize; j++ )
        {
            p->pV2TI[v] = i;
            p->pV2TJ[v] = j;
            Abc_ZddSetVarIJ( p, i, j, v++ );
        }
    assert( v == p->nVars );
}